

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_rank_function.cpp
# Opt level: O3

void __thiscall
duckdb::WindowPeerGlobalState::WindowPeerGlobalState
          (WindowPeerGlobalState *this,WindowPeerExecutor *executor,idx_t payload_count,
          ValidityMask *partition_mask,ValidityMask *order_mask)

{
  BoundWindowExpression *pBVar1;
  ClientContext *context;
  _Head_base<0UL,_duckdb::WindowTokenTree_*,_false> _Var2;
  _Head_base<0UL,_duckdb::WindowTokenTree_*,_false> this_00;
  
  WindowExecutorGlobalState::WindowExecutorGlobalState
            (&this->super_WindowExecutorGlobalState,&executor->super_WindowExecutor,payload_count,
             partition_mask,order_mask);
  (this->super_WindowExecutorGlobalState).super_WindowExecutorState._vptr_WindowExecutorState =
       (_func_int **)&PTR__WindowPeerGlobalState_0243fde0;
  (this->token_tree).
  super_unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::WindowTokenTree_*,_std::default_delete<duckdb::WindowTokenTree>_>.
  super__Head_base<0UL,_duckdb::WindowTokenTree_*,_false>._M_head_impl = (WindowTokenTree *)0x0;
  if ((executor->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (executor->arg_order_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pBVar1 = (executor->super_WindowExecutor).wexpr;
    context = (executor->super_WindowExecutor).context;
    this_00._M_head_impl = (WindowTokenTree *)operator_new(0xd8);
    WindowMergeSortTree::WindowMergeSortTree
              ((WindowMergeSortTree *)this_00._M_head_impl,context,&pBVar1->arg_orders,
               &executor->arg_order_idx,payload_count,false);
    ((this_00._M_head_impl)->super_WindowMergeSortTree)._vptr_WindowMergeSortTree =
         &PTR__WindowTokenTree_0243f800;
    ((WindowMergeSortTree *)&(this_00._M_head_impl)->deltas)->_vptr_WindowMergeSortTree =
         (_func_int **)0x0;
    *(ClientContext **)((long)&(this_00._M_head_impl)->deltas + 8) = (ClientContext *)0x0;
    *(pointer *)((long)&(this_00._M_head_impl)->deltas + 0x10) = (pointer)0x0;
    _Var2._M_head_impl =
         (this->token_tree).
         super_unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::WindowTokenTree_*,_std::default_delete<duckdb::WindowTokenTree>_>
         .super__Head_base<0UL,_duckdb::WindowTokenTree_*,_false>._M_head_impl;
    (this->token_tree).
    super_unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>._M_t.
    super___uniq_ptr_impl<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::WindowTokenTree_*,_std::default_delete<duckdb::WindowTokenTree>_>
    .super__Head_base<0UL,_duckdb::WindowTokenTree_*,_false>._M_head_impl = this_00._M_head_impl;
    if (_Var2._M_head_impl != (WindowTokenTree *)0x0) {
      (**(code **)(*(long *)&(_Var2._M_head_impl)->super_WindowMergeSortTree + 8))();
      return;
    }
  }
  return;
}

Assistant:

WindowPeerGlobalState(const WindowPeerExecutor &executor, const idx_t payload_count,
	                      const ValidityMask &partition_mask, const ValidityMask &order_mask)
	    : WindowExecutorGlobalState(executor, payload_count, partition_mask, order_mask) {
		if (!executor.arg_order_idx.empty()) {
			token_tree = make_uniq<WindowTokenTree>(executor.context, executor.wexpr.arg_orders, executor.arg_order_idx,
			                                        payload_count);
		}
	}